

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

string * create_swizzle_abi_cxx11_(string *__return_storage_ptr__,MSLComponentSwizzle swizzle)

{
  CompilerError *this;
  allocator *paVar1;
  char *pcVar2;
  allocator local_17;
  allocator local_16;
  allocator local_15;
  allocator local_14;
  allocator local_13;
  allocator local_12;
  allocator local_11;
  
  switch(swizzle) {
  case MSL_COMPONENT_SWIZZLE_IDENTITY:
    pcVar2 = "spvSwizzle::none";
    paVar1 = &local_11;
    break;
  case MSL_COMPONENT_SWIZZLE_ZERO:
    pcVar2 = "spvSwizzle::zero";
    paVar1 = &local_12;
    break;
  case MSL_COMPONENT_SWIZZLE_ONE:
    pcVar2 = "spvSwizzle::one";
    paVar1 = &local_13;
    break;
  case MSL_COMPONENT_SWIZZLE_R:
    pcVar2 = "spvSwizzle::red";
    paVar1 = &local_14;
    break;
  case MSL_COMPONENT_SWIZZLE_G:
    pcVar2 = "spvSwizzle::green";
    paVar1 = &local_15;
    break;
  case MSL_COMPONENT_SWIZZLE_B:
    pcVar2 = "spvSwizzle::blue";
    paVar1 = &local_16;
    break;
  case MSL_COMPONENT_SWIZZLE_A:
    pcVar2 = "spvSwizzle::alpha";
    paVar1 = &local_17;
    break;
  default:
    this = (CompilerError *)__cxa_allocate_exception(0x10);
    spirv_cross::CompilerError::CompilerError(this,"Invalid component swizzle.");
    __cxa_throw(this,&spirv_cross::CompilerError::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

static string create_swizzle(MSLComponentSwizzle swizzle)
{
	switch (swizzle)
	{
	case MSL_COMPONENT_SWIZZLE_IDENTITY:
		return "spvSwizzle::none";
	case MSL_COMPONENT_SWIZZLE_ZERO:
		return "spvSwizzle::zero";
	case MSL_COMPONENT_SWIZZLE_ONE:
		return "spvSwizzle::one";
	case MSL_COMPONENT_SWIZZLE_R:
		return "spvSwizzle::red";
	case MSL_COMPONENT_SWIZZLE_G:
		return "spvSwizzle::green";
	case MSL_COMPONENT_SWIZZLE_B:
		return "spvSwizzle::blue";
	case MSL_COMPONENT_SWIZZLE_A:
		return "spvSwizzle::alpha";
	default:
		SPIRV_CROSS_THROW("Invalid component swizzle.");
	}
}